

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O2

void __thiscall duckdb::UserTypeInfo::Serialize(UserTypeInfo *this,Serializer *serializer)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ExtraTypeInfo::Serialize(&this->super_ExtraTypeInfo,serializer);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,200,"user_type_name",&this->user_type_name);
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xc9,"catalog",&this->catalog,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xca,"schema",&this->schema,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::Value,true>>
            (serializer,0xcb,"user_type_modifiers",&this->user_type_modifiers);
  return;
}

Assistant:

void UserTypeInfo::Serialize(Serializer &serializer) const {
	ExtraTypeInfo::Serialize(serializer);
	serializer.WritePropertyWithDefault<string>(200, "user_type_name", user_type_name);
	serializer.WritePropertyWithDefault<string>(201, "catalog", catalog, string());
	serializer.WritePropertyWithDefault<string>(202, "schema", schema, string());
	serializer.WritePropertyWithDefault<vector<Value>>(203, "user_type_modifiers", user_type_modifiers);
}